

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall MyP2PClientConnection::OnClose(MyP2PClientConnection *this,SDKJsonResult *reason)

{
  bool bVar1;
  uint8_t data [5];
  TonkStatus cs;
  shared_ptr<MyClientConnection> *connection;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  *__range1;
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  connections;
  TonkStatus status;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  SDKJsonResult *in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff750;
  SDKResult in_stack_fffffffffffff754;
  SDKConnection *in_stack_fffffffffffff758;
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  *in_stack_fffffffffffff760;
  LogStringBuffer *in_stack_fffffffffffff788;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff790;
  LogStringBuffer *this_00;
  SDKConnectionList<MyClientConnection> *in_stack_fffffffffffff798;
  Channel *pCVar2;
  uint8_t local_804 [8];
  uint local_7fc [5];
  reference local_7e8;
  shared_ptr<MyClientConnection> *local_7e0;
  __normal_iterator<std::shared_ptr<MyClientConnection>_*,_std::vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>_>
  local_7d8;
  undefined1 *local_7d0;
  undefined1 local_7c8 [32];
  uint32_t local_7a8 [8];
  string local_788 [48];
  char *local_758;
  string *local_750;
  char *local_748;
  Channel *local_740;
  char *local_738;
  uint *local_730;
  char *local_728;
  uint *local_720;
  char *local_718;
  Channel *local_710;
  char *local_708;
  string *local_700;
  char *local_6f8;
  undefined4 local_6ec;
  Channel *local_6e8;
  undefined4 local_6dc;
  Channel *local_6d8;
  ostream aoStack_6b0 [256];
  SDKConnection *in_stack_fffffffffffffa50;
  undefined1 local_3a0 [16];
  ostream aoStack_390 [376];
  char *local_218;
  uint *local_210;
  char *local_208;
  uint *local_200;
  char *local_1f8;
  undefined4 local_1ec;
  Channel *local_1e8;
  char *local_1e0;
  uint *local_1d8;
  char *local_1d0;
  uint *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  LogStringBuffer *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  LogStringBuffer *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  uint *local_170;
  char *local_168;
  uint *local_160;
  char *local_158;
  undefined1 *local_150;
  LogStringBuffer *local_148;
  char *local_140;
  undefined1 *local_138;
  LogStringBuffer *local_130;
  char *local_128;
  uint *local_120;
  char *local_118;
  uint *local_110;
  undefined1 *local_108;
  LogStringBuffer *local_100;
  uint *local_f8;
  undefined1 *local_f0;
  LogStringBuffer *local_e8;
  uint *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  uint *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  char *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  char *local_80;
  uint *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  uint *local_60;
  undefined1 *local_58;
  LogStringBuffer *local_50;
  uint *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffff748);
  local_740 = &Logger;
  local_748 = "MyServerConnection: OnClose(";
  local_758 = ")";
  local_6e8 = &Logger;
  local_6ec = 2;
  local_6f8 = "MyServerConnection: OnClose(";
  local_708 = ")";
  local_6d8 = &Logger;
  local_6dc = 2;
  local_750 = local_788;
  local_700 = local_788;
  if ((int)Logger.ChannelMinLevel < 3) {
    logger::LogStringBuffer::LogStringBuffer
              ((LogStringBuffer *)
               CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750),
               (char *)in_stack_fffffffffffff748,Trace);
    std::operator<<(aoStack_6b0,(string *)&Logger.Prefix);
    std::operator<<(aoStack_6b0,"MyServerConnection: OnClose(");
    std::operator<<(aoStack_6b0,local_788);
    std::operator<<(aoStack_6b0,")");
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10aa4d);
  }
  std::__cxx11::string::~string(local_788);
  test::LogTonkStatus(in_stack_fffffffffffffa50);
  tonk::SDKConnection::GetStatus
            ((SDKConnection *)CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750));
  tonk::SDKConnectionList<MyClientConnection>::GetList(in_stack_fffffffffffff798);
  local_7d0 = local_7c8;
  local_7d8._M_current =
       (shared_ptr<MyClientConnection> *)
       std::
       vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
       ::begin((vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
                *)in_stack_fffffffffffff748);
  local_7e0 = (shared_ptr<MyClientConnection> *)
              std::
              vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
              ::end((vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
                     *)in_stack_fffffffffffff748);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<MyClientConnection>_*,_std::vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750),
                       (__normal_iterator<std::shared_ptr<MyClientConnection>_*,_std::vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>_>
                        *)in_stack_fffffffffffff748);
    if (!bVar1) break;
    local_7e8 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<MyClientConnection>_*,_std::vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>_>
                ::operator*(&local_7d8);
    std::__shared_ptr_access<MyClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<MyClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10ab1c);
    tonk::SDKConnection::GetStatus
              ((SDKConnection *)CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750)
              );
    local_720 = local_7fc;
    local_730 = local_7a8;
    local_710 = &Logger;
    local_718 = "Informing connection ";
    local_728 = " about ";
    local_738 = " disconnecting";
    if ((int)Logger.ChannelMinLevel < 3) {
      local_1e8 = &Logger;
      local_1ec = 2;
      local_1f8 = "Informing connection ";
      local_208 = " about ";
      local_218 = " disconnecting";
      pCVar2 = &Logger;
      local_210 = local_730;
      local_200 = local_720;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)
                 CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750),
                 (char *)in_stack_fffffffffffff748,Trace);
      local_1b8 = &((LogStringBuffer *)pCVar2)->field_0x38;
      local_1b0 = local_3a0;
      local_1c0 = local_1f8;
      local_1c8 = local_200;
      local_1d0 = local_208;
      local_1d8 = local_210;
      local_1e0 = local_218;
      local_1a8 = (LogStringBuffer *)pCVar2;
      local_1a0 = local_1b8;
      local_198 = local_1b0;
      local_190 = (LogStringBuffer *)pCVar2;
      local_188 = local_1b8;
      local_180 = local_1b0;
      std::operator<<(aoStack_390,(string *)local_1b8);
      local_150 = local_1b0;
      local_158 = local_1c0;
      local_160 = local_1c8;
      local_168 = local_1d0;
      local_170 = local_1d8;
      local_178 = local_1e0;
      local_138 = local_1b0;
      local_140 = local_1c0;
      local_c8 = local_1b0;
      local_d0 = local_1c0;
      this_00 = (LogStringBuffer *)pCVar2;
      local_148 = (LogStringBuffer *)pCVar2;
      local_130 = (LogStringBuffer *)pCVar2;
      std::operator<<((ostream *)(local_1b0 + 0x10),local_1c0);
      local_108 = local_150;
      local_110 = local_160;
      local_118 = local_168;
      local_120 = local_170;
      local_128 = local_178;
      local_f0 = local_150;
      local_f8 = local_160;
      local_d8 = local_150;
      local_e0 = local_160;
      buffer_00 = (LogStringBuffer *)pCVar2;
      local_100 = (LogStringBuffer *)pCVar2;
      local_e8 = (LogStringBuffer *)pCVar2;
      std::ostream::operator<<((ostream *)(local_150 + 0x10),*local_160);
      local_a8 = local_108;
      local_b0 = local_118;
      local_b8 = local_120;
      local_c0 = local_128;
      local_90 = local_108;
      local_98 = local_118;
      local_30 = local_108;
      local_38 = local_118;
      local_a0 = (LogStringBuffer *)pCVar2;
      local_88 = (LogStringBuffer *)pCVar2;
      std::operator<<((ostream *)(local_108 + 0x10),local_118);
      local_70 = local_a8;
      local_78 = local_b8;
      local_80 = local_c0;
      local_58 = local_a8;
      local_60 = local_b8;
      local_40 = local_a8;
      local_48 = local_b8;
      local_68 = (LogStringBuffer *)pCVar2;
      local_50 = (LogStringBuffer *)pCVar2;
      std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
      local_20 = local_70;
      local_28 = local_80;
      local_8 = local_70;
      local_10 = local_80;
      local_18 = (LogStringBuffer *)pCVar2;
      std::operator<<((ostream *)(local_70 + 0x10),local_80);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10b1b8);
    }
    tonk::WriteU32_LE(local_804,local_7a8[0]);
    in_stack_fffffffffffff754 =
         tonk::SDKConnection::Send
                   (in_stack_fffffffffffff758,
                    (void *)CONCAT44(in_stack_fffffffffffff754.Result,in_stack_fffffffffffff750),
                    (uint64_t)in_stack_fffffffffffff748,0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<MyClientConnection>_*,_std::vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>_>
    ::operator++(&local_7d8);
  }
  std::
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  ::~vector(in_stack_fffffffffffff760);
  return;
}

Assistant:

void MyP2PClientConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("MyServerConnection: OnClose(", reason.ToString(), ")");

    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Client->ClientList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();
        Logger.Info("Informing connection ", cs.LocallyAssignedIdForRemoteHost, " about ", status.LocallyAssignedIdForRemoteHost, " disconnecting");

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionRemoved;
        tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }
}